

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# marker-index.cc
# Opt level: O1

Node * __thiscall
MarkerIndex::Iterator::insert_splice_boundary(Iterator *this,Point *position,bool is_insertion_end)

{
  bool bVar1;
  int iVar2;
  Node *unaff_R13;
  
  reset(this);
  do {
    iVar2 = Point::compare(position,&this->current_node_position);
    if (iVar2 == 0 && !is_insertion_end) {
      unaff_R13 = this->current_node;
LAB_00164a9b:
      bVar1 = false;
    }
    else {
      if (iVar2 < 0) {
        if (this->current_node->left == (Node *)0x0) {
          insert_left_child(this,position);
          unaff_R13 = this->current_node->left;
          goto LAB_00164a9b;
        }
        descend_left(this);
      }
      else {
        if (this->current_node->right == (Node *)0x0) {
          insert_right_child(this,position);
          unaff_R13 = this->current_node->right;
          goto LAB_00164a9b;
        }
        descend_right(this);
      }
      bVar1 = true;
    }
    if (!bVar1) {
      return unaff_R13;
    }
  } while( true );
}

Assistant:

MarkerIndex::Node *MarkerIndex::Iterator::insert_splice_boundary(const Point &position, bool is_insertion_end) {
  reset();

  while (true) {
    int comparison = position.compare(current_node_position);
    if (comparison == 0 && !is_insertion_end) {
      return current_node;
    } else if (comparison < 0) {
      if (current_node->left) {
        descend_left();
      } else {
        insert_left_child(position);
        return current_node->left;
      }
    } else { // comparison > 0
      if (current_node->right) {
        descend_right();
      } else {
        insert_right_child(position);
        return current_node->right;
      }
    }
  }
}